

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O2

WJTL_STATUS TestNumbers(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  WJTL_STATUS WVar15;
  WJTL_STATUS WVar16;
  WJTL_STATUS WVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  WJTL_STATUS WVar20;
  WJTL_STATUS WVar21;
  WJTL_STATUS WVar22;
  WJTL_STATUS WVar23;
  WJTL_STATUS WVar24;
  WJTL_STATUS WVar25;
  WJTL_STATUS WVar26;
  WJTL_STATUS WVar27;
  
  WVar1 = VerifyOutputUnsigned(10,"10");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x71);
  WVar2 = VerifyOutputUnsigned(0,"0");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x72);
  WVar3 = VerifyOutputUnsigned(0xffffffffffffffff,"18446744073709551615");
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( (18446744073709551615UL), \"18446744073709551615\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x73);
  WVar4 = VerifyOutputSigned(10,"10");
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x75);
  WVar5 = VerifyOutputSigned(-10,"-10");
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( -10, \"-10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x76);
  WVar6 = VerifyOutputFloat(0.0,"0");
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 0.0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x78);
  WVar7 = VerifyOutputFloat(10.1,"10.1");
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 10.1, \"10.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x79);
  WVar8 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.34e+125, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7a);
  WVar9 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 234e123, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7b);
  WVar10 = VerifyOutputFloat(2.1,"2.1");
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1, \"2.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7d);
  WVar11 = VerifyOutputFloat(2.11,"2.11");
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11, \"2.11\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7e);
  WVar12 = VerifyOutputFloat(2.111,"2.111");
  WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111, \"2.111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7f);
  WVar13 = VerifyOutputFloat(2.1111,"2.1111");
  WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111, \"2.1111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x80);
  WVar14 = VerifyOutputFloat(2.11111,"2.11111");
  WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111, \"2.11111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x81);
  WVar15 = VerifyOutputFloat(2.111111,"2.111111");
  WjTestLib_Assert(WVar15 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111, \"2.111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x82);
  WVar16 = VerifyOutputFloat(2.1111111,"2.1111111");
  WjTestLib_Assert(WVar16 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111, \"2.1111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x83);
  WVar17 = VerifyOutputFloat(2.11111111,"2.11111111");
  WjTestLib_Assert(WVar17 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111, \"2.11111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x84);
  WVar18 = VerifyOutputFloat(2.111111111,"2.111111111");
  WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111, \"2.111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x85);
  WVar19 = VerifyOutputFloat(2.1111111111,"2.1111111111");
  WjTestLib_Assert(WVar19 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111, \"2.1111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x86);
  WVar20 = VerifyOutputFloat(2.11111111111,"2.11111111111");
  WjTestLib_Assert(WVar20 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111, \"2.11111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x87);
  WVar21 = VerifyOutputFloat(2.111111111111,"2.111111111111");
  WjTestLib_Assert(WVar21 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111, \"2.111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x88);
  WVar22 = VerifyOutputFloat(2.1111111111111,"2.1111111111111");
  WjTestLib_Assert(WVar22 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111111, \"2.1111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x89);
  WVar23 = VerifyOutputFloat(2.11111111111111,"2.11111111111111");
  WjTestLib_Assert(WVar23 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111111, \"2.11111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8a);
  WVar24 = VerifyOutputFloat(2.111111111111111,"2.111111111111111");
  WjTestLib_Assert(WVar24 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111111, \"2.111111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8b);
  WVar25 = VerifyOutputFloat(1.79769313486232e+308,"1.797693134862316e+308");
  WjTestLib_Assert(WVar25 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 1.7976931348623157e+308, \"1.797693134862316e+308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x91);
  WVar26 = VerifyOutputFloat(2.2250738585072014e-308,"2.225073858507201e-308");
  WjTestLib_Assert(WVar26 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.2250738585072014e-308, \"2.225073858507201e-308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x92);
  WVar27 = WJTL_STATUS_FAILED;
  if (((WVar26 == WJTL_STATUS_SUCCESS && WVar25 == WJTL_STATUS_SUCCESS) &&
      ((((WVar21 == WJTL_STATUS_SUCCESS && WVar22 == WJTL_STATUS_SUCCESS) &&
        WVar23 == WJTL_STATUS_SUCCESS) &&
       ((WVar19 == WJTL_STATUS_SUCCESS && WVar20 == WJTL_STATUS_SUCCESS) &&
       (WVar18 == WJTL_STATUS_SUCCESS && WVar17 == WJTL_STATUS_SUCCESS))) &&
      WVar24 == WJTL_STATUS_SUCCESS)) &&
      ((((((WVar5 == WJTL_STATUS_SUCCESS && WVar6 == WJTL_STATUS_SUCCESS) &&
          ((WVar3 == WJTL_STATUS_SUCCESS && WVar4 == WJTL_STATUS_SUCCESS) &&
          (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS))) &&
         WVar7 == WJTL_STATUS_SUCCESS) && WVar8 == WJTL_STATUS_SUCCESS) &&
       WVar16 == WJTL_STATUS_SUCCESS) &&
      (((WVar13 == WJTL_STATUS_SUCCESS && WVar14 == WJTL_STATUS_SUCCESS) &&
       WVar15 == WJTL_STATUS_SUCCESS) &&
      ((WVar11 == WJTL_STATUS_SUCCESS && WVar12 == WJTL_STATUS_SUCCESS) &&
      (WVar10 == WJTL_STATUS_SUCCESS && WVar9 == WJTL_STATUS_SUCCESS))))) {
    WVar27 = WJTL_STATUS_SUCCESS;
  }
  return WVar27;
}

Assistant:

static
WJTL_STATUS
    TestNumbers
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( VerifyOutputUnsigned( 10, "10" ) );
    JL_ASSERT_SUCCESS( VerifyOutputUnsigned( 0, "0" ) );
    JL_ASSERT_SUCCESS( VerifyOutputUnsigned( UINT64_MAX, "18446744073709551615" ) );

    JL_ASSERT_SUCCESS( VerifyOutputSigned( 10, "10" ) );
    JL_ASSERT_SUCCESS( VerifyOutputSigned( -10, "-10" ) );

    JL_ASSERT_SUCCESS( VerifyOutputFloat( 0.0, "0" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 10.1, "10.1" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.34e+125, "2.34e+125" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 234e123, "2.34e+125" ) );

    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.1, "2.1" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.11, "2.11" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.111, "2.111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.1111, "2.1111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.11111, "2.11111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.111111, "2.111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.1111111, "2.1111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.11111111, "2.11111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.111111111, "2.111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.1111111111, "2.1111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.11111111111, "2.11111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.111111111111, "2.111111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.1111111111111, "2.1111111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.11111111111111, "2.11111111111111" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( 2.111111111111111, "2.111111111111111" ) );

    // Note there is slight rounding from the value of DBL_MAX (1.7976931348623158e+308)
    // and DBL_MIN (2.2250738585072014e-308)
    // This is because we don't output the full precision of the float. If we did then simple values
    // such as 2.1 would end up as 2.1000000000000001 due to 2.1 not being perfectly representable in floating format.
    JL_ASSERT_SUCCESS( VerifyOutputFloat( DBL_MAX, "1.797693134862316e+308" ) );
    JL_ASSERT_SUCCESS( VerifyOutputFloat( DBL_MIN, "2.225073858507201e-308" ) );

    return TestReturn;
}